

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

MP<8UL,_GF2::MOGrevlex<8UL>_> * __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::SPoly
          (MP<8UL,_GF2::MOGrevlex<8UL>_> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *poly)

{
  bool bVar1;
  list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *this_00;
  MM<8UL> *mRight;
  _Self *__x;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_RDI;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *unaff_retaddr;
  const_iterator iter_1;
  iterator iter;
  MM<8UL> m;
  MM<8UL> lm;
  list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *in_stack_ffffffffffffff98;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_ffffffffffffffa0;
  _Self in_stack_ffffffffffffffc0;
  _List_const_iterator<GF2::MM<8UL>_> local_38;
  _Self local_30;
  _Self local_28 [5];
  
  MM<8UL>::MM((MM<8UL> *)0x1d4932);
  MM<8UL>::MM((MM<8UL> *)0x1d493c);
  this_00 = (list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)LM(in_stack_ffffffffffffffa0);
  mRight = LM(in_stack_ffffffffffffffa0);
  LM(in_stack_ffffffffffffffa0);
  MM<8UL>::LCM((MM<8UL> *)in_stack_ffffffffffffffc0._M_node,(MM<8UL> *)in_RDI,(MM<8UL> *)this_00);
  MM<8UL>::operator=((MM<8UL> *)in_stack_ffffffffffffffa0,(MM<8UL> *)in_stack_ffffffffffffff98);
  MM<8UL>::operator/=((MM<8UL> *)this_00,mRight);
  PopLM((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1d499a);
  local_28[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::begin
                 (in_stack_ffffffffffffff98);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::end
                   (in_stack_ffffffffffffff98);
    bVar1 = std::operator!=(local_28,&local_30);
    if (!bVar1) break;
    std::_List_iterator<GF2::MM<8UL>_>::operator*((_List_iterator<GF2::MM<8UL>_> *)0x1d49d7);
    MM<8ul>::operator*=((MM<8UL> *)in_stack_ffffffffffffffa0,(MM<8UL> *)in_stack_ffffffffffffff98);
    std::_List_iterator<GF2::MM<8UL>_>::operator++(local_28);
  }
  LM(in_stack_ffffffffffffffa0);
  MM<8UL>::operator/=((MM<8UL> *)this_00,mRight);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::begin
                 (in_stack_ffffffffffffff98);
  while( true ) {
    __x = std::_List_const_iterator<GF2::MM<8UL>_>::operator++(&local_38);
    std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::end(in_stack_ffffffffffffff98)
    ;
    bVar1 = std::operator!=(__x,(_Self *)&stack0xffffffffffffffc0);
    if (!bVar1) break;
    std::_List_const_iterator<GF2::MM<8UL>_>::operator*
              ((_List_const_iterator<GF2::MM<8UL>_> *)0x1d4a53);
    MM<8UL>::operator=((MM<8UL> *)__x,(MM<8UL> *)in_stack_ffffffffffffff98);
    MM<8ul>::operator*=((MM<8UL> *)__x,(MM<8UL> *)in_stack_ffffffffffffff98);
    std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::push_back(this_00,mRight);
  }
  Normalize(unaff_retaddr);
  return in_RDI;
}

Assistant:

MP& SPoly(const MP& poly)
	{
		// предусловия
		assert(IsConsistent(poly) && this != &poly);
		// сбор мономов
		MM<_n> lm, m;
		(m = lm.LCM(LM(), poly.LM())) /= LM();
		PopLM();
		for (iterator iter = begin(); iter != end(); ++iter)
			*iter *= m;
		lm /= poly.LM();
		for (const_iterator iter = poly.begin(); ++iter != poly.end();)
			push_back((m = *iter) *= lm);
		// нормализация
		Normalize();
		return *this;
	}